

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_const_std::vector<int,_std::allocator<int>_>_>
* fmt::v6::internal::make_args_checked<std::vector<int,std::allocator<int>>const&,char[3],char>
            (char (*format_str) [3],remove_reference_t<const_std::vector<int>_&> *args)

{
  vector<int,_std::allocator<int>_> *in_RSI;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_const_std::vector<int,_std::allocator<int>_>_>
  *in_RDI;
  undefined8 local_18;
  
  check_format_string<const_std::vector<int,_std::allocator<int>_>_&,_char[3],_0>
            ((char (*) [3])in_RDI);
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>,_const_std::vector<int,_std::allocator<int>_>_>
  ::format_arg_store(in_RDI,in_RSI);
  return local_18;
}

Assistant:

inline format_arg_store<buffer_context<Char>, remove_reference_t<Args>...>
make_args_checked(const S& format_str,
                  const remove_reference_t<Args>&... args) {
  static_assert(
      all_true<(!std::is_base_of<view, remove_reference_t<Args>>::value ||
                !std::is_reference<Args>::value)...>::value,
      "passing views as lvalues is disallowed");
  check_format_string<Args...>(format_str);
  return {args...};
}